

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O0

void __thiscall SquareMatrix_Basics3_Test::TestBody(SquareMatrix_Basics3_Test *this)

{
  initializer_list<float> v_00;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  SquareMatrix<3> *pSVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  array<float,_3> aVar11;
  Vector3<float> VVar12;
  AssertionResult gtest_ar__4;
  SquareMatrix<3> degen;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar__3;
  SquareMatrix<3> ms;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar__2;
  optional<pbrt::SquareMatrix<3>_> inv;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  Vector3f v3t;
  Vector3f v3;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  array<float,_3> vt;
  array<float,_3> v;
  AssertionResult gtest_ar_3;
  SquareMatrix<3> mt;
  AssertionResult gtest_ar__1;
  SquareMatrix<3> m;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  SquareMatrix<3> m3;
  float y;
  float in_stack_fffffffffffff88c;
  undefined4 in_stack_fffffffffffff890;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffff894;
  undefined4 uVar14;
  int in_stack_fffffffffffff89c;
  int in_stack_fffffffffffff8a0;
  undefined2 in_stack_fffffffffffff8a4;
  undefined1 in_stack_fffffffffffff8a6;
  undefined1 in_stack_fffffffffffff8a7;
  Vector3<float> *in_stack_fffffffffffff8a8;
  int in_stack_fffffffffffff8b0;
  int in_stack_fffffffffffff8b4;
  int args_1;
  undefined8 in_stack_fffffffffffff8b8;
  Type type;
  int in_stack_fffffffffffff8c0;
  undefined2 in_stack_fffffffffffff8c4;
  undefined1 in_stack_fffffffffffff8c6;
  undefined1 in_stack_fffffffffffff8c7;
  SquareMatrix<3> *in_stack_fffffffffffff8c8;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  int in_stack_fffffffffffff8e0;
  int in_stack_fffffffffffff8e8;
  int iVar15;
  optional<pbrt::SquareMatrix<3>_> *this_00;
  int in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f4;
  undefined4 uVar16;
  char *in_stack_fffffffffffff8f8;
  char *in_stack_fffffffffffff900;
  AssertionResult *pAVar17;
  undefined7 in_stack_fffffffffffff908;
  undefined1 in_stack_fffffffffffff90f;
  AssertHelper *in_stack_fffffffffffff910;
  undefined7 in_stack_fffffffffffff940;
  undefined1 in_stack_fffffffffffff947;
  SquareMatrix<3> *in_stack_fffffffffffff948;
  char *in_stack_fffffffffffff950;
  undefined7 in_stack_fffffffffffff958;
  undefined1 in_stack_fffffffffffff95f;
  string local_5a0 [48];
  AssertionResult local_570 [9];
  AssertionResult local_4d8;
  string local_4c8 [48];
  AssertionResult local_498 [7];
  AssertionResult local_428;
  string local_418 [48];
  AssertionResult local_3e8 [3];
  SquareMatrix<3> *in_stack_fffffffffffffc48;
  AssertionResult local_398 [2];
  undefined4 local_374;
  AssertionResult local_370 [2];
  undefined4 local_34c;
  AssertionResult local_348;
  Tuple3<pbrt::Vector3,_float> local_338;
  Tuple3<pbrt::Vector3,_float> local_328 [3];
  undefined4 local_2fc;
  AssertionResult local_2f8 [2];
  undefined4 local_2d4;
  AssertionResult local_2d0 [2];
  undefined4 local_2ac;
  AssertionResult local_2a8;
  float local_298 [2];
  float local_290;
  array<float,_3> local_288;
  undefined4 local_27c;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 *local_270;
  undefined8 local_268;
  AssertionResult local_218 [3];
  string local_1e0 [48];
  AssertionResult local_1b0;
  SquareMatrix<3> local_19c [3];
  AssertionResult local_120 [4];
  AssertionResult local_d8 [4];
  AssertionResult local_90;
  string local_80 [64];
  AssertionResult local_40;
  SquareMatrix<3> local_2c;
  undefined1 auVar10 [56];
  
  pbrt::SquareMatrix<3>::SquareMatrix(&local_2c);
  pbrt::SquareMatrix<3>::IsIdentity(&local_2c);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
             SUB41((uint)in_stack_fffffffffffff88c >> 0x18,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
               in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
               (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,
               (Message *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
    std::__cxx11::string::~string(local_80);
    testing::Message::~Message((Message *)0x5ed893);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ed90e);
  uVar14 = 1;
  uVar13 = 0;
  pbrt::SquareMatrix<3>::SquareMatrix<int,int,int,int,int,int,int,int>
            ((SquareMatrix<3> *)
             CONCAT17(in_stack_fffffffffffff8c7,
                      CONCAT16(in_stack_fffffffffffff8c6,
                               CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
             (Float)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(int)in_stack_fffffffffffff8b8,
             in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0,
             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8,
             in_stack_fffffffffffff8e0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8f0);
  testing::internal::EqHelper<false>::Compare<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((char *)in_stack_fffffffffffff8a8,
             (char *)CONCAT17(in_stack_fffffffffffff8a7,
                              CONCAT16(in_stack_fffffffffffff8a6,
                                       CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                      )),
             (SquareMatrix<3> *)CONCAT44(in_stack_fffffffffffff89c,uVar14),
             (SquareMatrix<3> *)CONCAT44(in_stack_fffffffffffff894,uVar13));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))));
    testing::AssertionResult::failure_message((AssertionResult *)0x5ed9f6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,
               (Message *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    testing::Message::~Message((Message *)0x5eda59);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5edab1);
  uVar13 = 0;
  pbrt::SquareMatrix<3>::SquareMatrix<int,int,int,int,int,int,int,int>
            ((SquareMatrix<3> *)
             CONCAT17(in_stack_fffffffffffff8c7,
                      CONCAT16(in_stack_fffffffffffff8c6,
                               CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
             (Float)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(int)in_stack_fffffffffffff8b8,
             in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0,
             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8,
             in_stack_fffffffffffff8e0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8f0);
  testing::internal::CmpHelperNE<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((char *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
             in_stack_fffffffffffff950,in_stack_fffffffffffff948,
             (SquareMatrix<3> *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))));
    testing::AssertionResult::failure_message((AssertionResult *)0x5edb95);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,
               (Message *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    testing::Message::~Message((Message *)0x5edbf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5edc50);
  uVar14 = 3;
  uVar13 = 0;
  pbrt::SquareMatrix<3>::SquareMatrix<int,int,int,int,int,int,int,int>
            ((SquareMatrix<3> *)
             CONCAT17(in_stack_fffffffffffff8c7,
                      CONCAT16(in_stack_fffffffffffff8c6,
                               CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
             (Float)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(int)in_stack_fffffffffffff8b8,
             in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0,
             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8,
             in_stack_fffffffffffff8e0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8f0);
  pbrt::SquareMatrix<3>::Diag<int,int>
            ((Float)CONCAT13(in_stack_fffffffffffff8a7,
                             CONCAT12(in_stack_fffffffffffff8a6,in_stack_fffffffffffff8a4)),
             in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c);
  testing::internal::EqHelper<false>::Compare<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((char *)in_stack_fffffffffffff8a8,
             (char *)CONCAT17(in_stack_fffffffffffff8a7,
                              CONCAT16(in_stack_fffffffffffff8a6,
                                       CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                      )),
             (SquareMatrix<3> *)CONCAT44(in_stack_fffffffffffff89c,uVar14),
             (SquareMatrix<3> *)CONCAT44(in_stack_fffffffffffff894,uVar13));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))));
    testing::AssertionResult::failure_message((AssertionResult *)0x5edd73);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,
               (Message *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    testing::Message::~Message((Message *)0x5eddd6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ede2e);
  uVar13 = 8;
  pbrt::SquareMatrix<3>::SquareMatrix<int,int,int,int,int,int,int,int>
            ((SquareMatrix<3> *)
             CONCAT17(in_stack_fffffffffffff8c7,
                      CONCAT16(in_stack_fffffffffffff8c6,
                               CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
             (Float)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(int)in_stack_fffffffffffff8b8,
             in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0,
             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8,
             in_stack_fffffffffffff8e0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8f0);
  pbrt::SquareMatrix<3>::IsIdentity(local_19c);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff894,uVar13),
             SUB41((uint)in_stack_fffffffffffff88c >> 0x18,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
               in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
               (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,
               (Message *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    std::__cxx11::string::~string(local_1e0);
    testing::Message::~Message((Message *)0x5edfa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ee01b);
  uVar14 = 9;
  uVar13 = 6;
  y = 4.2039e-45;
  auVar10 = (undefined1  [56])0x0;
  pbrt::SquareMatrix<3>::SquareMatrix<int,int,int,int,int,int,int,int>
            ((SquareMatrix<3> *)
             CONCAT17(in_stack_fffffffffffff8c7,
                      CONCAT16(in_stack_fffffffffffff8c6,
                               CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
             (Float)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(int)in_stack_fffffffffffff8b8,
             in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0,
             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8,
             in_stack_fffffffffffff8e0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8f0);
  pbrt::Transpose<3>((SquareMatrix<3> *)
                     CONCAT17(in_stack_fffffffffffff8c7,
                              CONCAT16(in_stack_fffffffffffff8c6,
                                       CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0)
                                      )));
  testing::internal::EqHelper<false>::Compare<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((char *)in_stack_fffffffffffff8a8,
             (char *)CONCAT17(in_stack_fffffffffffff8a7,
                              CONCAT16(in_stack_fffffffffffff8a6,
                                       CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                      )),
             (SquareMatrix<3> *)CONCAT44(in_stack_fffffffffffff89c,uVar14),
             (SquareMatrix<3> *)CONCAT44(in_stack_fffffffffffff894,uVar13));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_218);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))));
    testing::AssertionResult::failure_message((AssertionResult *)0x5ee129);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,
               (Message *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    testing::Message::~Message((Message *)0x5ee18c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ee1e4);
  local_27c = 0x3f800000;
  local_278 = 0xc0000000;
  local_274 = 0x40800000;
  local_270 = &local_27c;
  local_268 = 3;
  v_00._M_len._0_7_ = in_stack_fffffffffffff8d0;
  v_00._M_array = (iterator)in_stack_fffffffffffff8c8;
  v_00._M_len._7_1_ = in_stack_fffffffffffff8d7;
  pstd::array<float,_3>::array
            ((array<float,_3> *)
             CONCAT17(in_stack_fffffffffffff8c7,
                      CONCAT16(in_stack_fffffffffffff8c6,
                               CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),v_00)
  ;
  aVar11 = pbrt::operator*((SquareMatrix<3> *)
                           CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                           (array<float,_3> *)in_stack_fffffffffffff8a8);
  local_290 = aVar11.values[2];
  auVar8._0_8_ = aVar11.values._0_8_;
  auVar8._8_56_ = auVar10;
  local_298 = (float  [2])vmovlpd_avx(auVar8._0_16_);
  local_2ac = 9;
  local_288.values._0_8_ = local_298;
  local_288.values[2] = local_290;
  pstd::array<float,_3>::operator[](&local_288,0);
  testing::internal::EqHelper<false>::Compare<int,float>
            ((char *)in_stack_fffffffffffff8a8,
             (char *)CONCAT17(in_stack_fffffffffffff8a7,
                              CONCAT16(in_stack_fffffffffffff8a6,
                                       CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                      )),(int *)CONCAT44(in_stack_fffffffffffff89c,uVar14),
             (float *)CONCAT44(in_stack_fffffffffffff894,uVar13));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))));
    testing::AssertionResult::failure_message((AssertionResult *)0x5ee344);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,
               (Message *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    testing::Message::~Message((Message *)0x5ee3a7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ee3ff);
  local_2d4 = 0x12;
  pstd::array<float,_3>::operator[](&local_288,1);
  testing::internal::EqHelper<false>::Compare<int,float>
            ((char *)in_stack_fffffffffffff8a8,
             (char *)CONCAT17(in_stack_fffffffffffff8a7,
                              CONCAT16(in_stack_fffffffffffff8a6,
                                       CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                      )),(int *)CONCAT44(in_stack_fffffffffffff89c,uVar14),
             (float *)CONCAT44(in_stack_fffffffffffff894,uVar13));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))));
    testing::AssertionResult::failure_message((AssertionResult *)0x5ee4b9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,
               (Message *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    testing::Message::~Message((Message *)0x5ee51c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ee574);
  local_2fc = 0x1b;
  pstd::array<float,_3>::operator[](&local_288,2);
  pAVar17 = local_2f8;
  testing::internal::EqHelper<false>::Compare<int,float>
            ((char *)in_stack_fffffffffffff8a8,
             (char *)CONCAT17(in_stack_fffffffffffff8a7,
                              CONCAT16(in_stack_fffffffffffff8a6,
                                       CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                      )),(int *)CONCAT44(in_stack_fffffffffffff89c,uVar14),
             (float *)CONCAT44(in_stack_fffffffffffff894,uVar13));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar17);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))));
    testing::AssertionResult::failure_message((AssertionResult *)0x5ee62e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,
               (Message *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    testing::Message::~Message((Message *)0x5ee691);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ee6e9);
  auVar10 = (undefined1  [56])0x0;
  pbrt::Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffff894,uVar13),in_stack_fffffffffffff88c,
             y,0.0);
  uVar6 = (undefined1)((uint)in_stack_fffffffffffff88c >> 0x18);
  VVar12 = pbrt::operator*((SquareMatrix<3> *)
                           CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                           in_stack_fffffffffffff8a8);
  local_338.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar10;
  local_338._0_8_ = vmovlpd_avx(auVar9._0_16_);
  local_34c = 9;
  local_328[0]._0_8_ = local_338._0_8_;
  local_328[0].z = local_338.z;
  pbrt::Tuple3<pbrt::Vector3,_float>::operator[](local_328,0);
  testing::internal::EqHelper<false>::Compare<int,float>
            ((char *)in_stack_fffffffffffff8a8,
             (char *)CONCAT17(in_stack_fffffffffffff8a7,
                              CONCAT16(in_stack_fffffffffffff8a6,
                                       CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                      )),(int *)CONCAT44(in_stack_fffffffffffff89c,uVar14),
             (float *)CONCAT44(in_stack_fffffffffffff894,uVar13));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_348);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))));
    testing::AssertionResult::failure_message((AssertionResult *)0x5ee812);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,
               (Message *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    testing::Message::~Message((Message *)0x5ee875);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ee8cd);
  local_374 = 0x12;
  pbrt::Tuple3<pbrt::Vector3,_float>::operator[](local_328,1);
  testing::internal::EqHelper<false>::Compare<int,float>
            ((char *)in_stack_fffffffffffff8a8,
             (char *)CONCAT17(in_stack_fffffffffffff8a7,
                              CONCAT16(in_stack_fffffffffffff8a6,
                                       CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                      )),(int *)CONCAT44(in_stack_fffffffffffff89c,uVar14),
             (float *)CONCAT44(in_stack_fffffffffffff894,uVar13));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))));
    in_stack_fffffffffffff910 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x5ee987);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,
               (Message *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    testing::Message::~Message((Message *)0x5ee9ea);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5eea3f);
  pbrt::Tuple3<pbrt::Vector3,_float>::operator[](local_328,2);
  pAVar17 = local_398;
  testing::internal::EqHelper<false>::Compare<int,float>
            ((char *)in_stack_fffffffffffff8a8,
             (char *)CONCAT17(in_stack_fffffffffffff8a7,
                              CONCAT16(in_stack_fffffffffffff8a6,
                                       CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                      )),(int *)CONCAT44(in_stack_fffffffffffff89c,uVar14),
             (float *)CONCAT44(in_stack_fffffffffffff894,uVar13));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar17);
  if (!(bool)uVar2) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))));
    in_stack_fffffffffffff8f8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x5eeaf3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    testing::Message::~Message((Message *)0x5eeb50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5eeba5);
  this_00 = (optional<pbrt::SquareMatrix<3>_> *)(local_3e8 + 1);
  pbrt::Inverse<3>(in_stack_fffffffffffffc48);
  bVar1 = pstd::optional<pbrt::SquareMatrix<3>_>::has_value(this_00);
  iVar15 = (int)this_00;
  uVar16 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8f4);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff894,uVar13),(bool)uVar6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3e8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar2,in_stack_fffffffffffff908),&pAVar17->success_,
               in_stack_fffffffffffff8f8,(char *)CONCAT44(uVar16,in_stack_fffffffffffff8f0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    std::__cxx11::string::~string(local_418);
    testing::Message::~Message((Message *)0x5eecf7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5eed6f);
  pstd::optional<pbrt::SquareMatrix<3>_>::operator*((optional<pbrt::SquareMatrix<3>_> *)0x5eed7c);
  testing::internal::EqHelper<false>::Compare<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((char *)in_stack_fffffffffffff8a8,
             (char *)CONCAT17(in_stack_fffffffffffff8a7,
                              CONCAT16(in_stack_fffffffffffff8a6,
                                       CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                      )),
             (SquareMatrix<3> *)CONCAT44(in_stack_fffffffffffff89c,uVar14),
             (SquareMatrix<3> *)CONCAT44(in_stack_fffffffffffff894,uVar13));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_428);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))));
    in_stack_fffffffffffff8c8 =
         (SquareMatrix<3> *)testing::AssertionResult::failure_message((AssertionResult *)0x5eee16);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffff8c7,
                        CONCAT16(in_stack_fffffffffffff8c6,
                                 CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    testing::Message::~Message((Message *)0x5eee73);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5eeecb);
  uVar14 = 0xffffffff;
  uVar13 = 0;
  pbrt::SquareMatrix<3>::SquareMatrix<int,int,int,int,int,int,int,int>
            ((SquareMatrix<3> *)
             CONCAT17(in_stack_fffffffffffff8c7,
                      CONCAT16(in_stack_fffffffffffff8c6,
                               CONCAT24(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0))),
             (Float)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(int)in_stack_fffffffffffff8b8,
             in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0,
             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8,
             in_stack_fffffffffffff8e0,iVar15,in_stack_fffffffffffff8f0);
  pbrt::Inverse<3>(in_stack_fffffffffffffc48);
  pstd::optional<pbrt::SquareMatrix<3>_>::operator=
            ((optional<pbrt::SquareMatrix<3>_> *)
             CONCAT17(in_stack_fffffffffffff8a7,
                      CONCAT16(in_stack_fffffffffffff8a6,
                               CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0))),
             (optional<pbrt::SquareMatrix<3>_> *)CONCAT44(in_stack_fffffffffffff89c,uVar14));
  pstd::optional<pbrt::SquareMatrix<3>_>::~optional((optional<pbrt::SquareMatrix<3>_> *)0x5eef46);
  uVar3 = pstd::optional<pbrt::SquareMatrix<3>_>::has_value
                    ((optional<pbrt::SquareMatrix<3>_> *)(local_3e8 + 1));
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff894,uVar13),(bool)uVar6);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_498);
  if (!(bool)uVar4) {
    testing::Message::Message
              ((Message *)
               CONCAT17(uVar3,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffff8c4,
                                                      in_stack_fffffffffffff8c0))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar2,in_stack_fffffffffffff908),&pAVar17->success_,
               in_stack_fffffffffffff8f8,(char *)CONCAT44(uVar16,in_stack_fffffffffffff8f0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar3,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffff8c4,
                                                      in_stack_fffffffffffff8c0))),
               (Type)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    std::__cxx11::string::~string(local_4c8);
    testing::Message::~Message((Message *)0x5ef08e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ef109);
  uVar13 = 0xffffffff;
  pbrt::SquareMatrix<3>::SquareMatrix<int,int,int,double,int,int,int,int>
            (in_stack_fffffffffffff8c8,
             (Float)CONCAT13(uVar3,CONCAT12(uVar4,in_stack_fffffffffffff8c4)),
             in_stack_fffffffffffff8c0,(int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
             (int)in_stack_fffffffffffff8b8,
             (double)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8,
             in_stack_fffffffffffff8e0,iVar15);
  pSVar7 = pstd::optional<pbrt::SquareMatrix<3>_>::operator*
                     ((optional<pbrt::SquareMatrix<3>_> *)0x5ef154);
  testing::internal::EqHelper<false>::Compare<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((char *)in_stack_fffffffffffff8a8,
             (char *)CONCAT17(in_stack_fffffffffffff8a7,
                              CONCAT16(in_stack_fffffffffffff8a6,
                                       CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                                      )),
             (SquareMatrix<3> *)CONCAT44(in_stack_fffffffffffff89c,uVar14),
             (SquareMatrix<3> *)CONCAT44(in_stack_fffffffffffff894,uVar13));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4d8);
  args_1 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8b4);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               CONCAT17(uVar3,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffff8c4,
                                                      in_stack_fffffffffffff8c0))));
    in_stack_fffffffffffff8a8 =
         (Vector3<float> *)testing::AssertionResult::failure_message((AssertionResult *)0x5ef1ee);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar3,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffff8c4,
                                                      in_stack_fffffffffffff8c0))),
               (Type)((ulong)pSVar7 >> 0x20),(char *)CONCAT44(args_1,in_stack_fffffffffffff8b0),
               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8a7,
                                CONCAT16(in_stack_fffffffffffff8a6,
                                         CONCAT24(in_stack_fffffffffffff8a4,
                                                  in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    testing::Message::~Message((Message *)0x5ef24b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ef2a3);
  uVar14 = 1;
  uVar13 = 1;
  pbrt::SquareMatrix<3>::SquareMatrix<int,int,int,int,int,int,int,int>
            ((SquareMatrix<3> *)
             CONCAT17(uVar3,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffff8c4,
                                                    in_stack_fffffffffffff8c0))),
             (Float)((ulong)pSVar7 >> 0x20),(int)pSVar7,args_1,in_stack_fffffffffffff8b0,
             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),(int)in_stack_fffffffffffff8a8,
             in_stack_fffffffffffff8e0,iVar15,in_stack_fffffffffffff8f0);
  type = (Type)((ulong)pSVar7 >> 0x20);
  iVar15 = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
  pbrt::Inverse<3>(in_stack_fffffffffffffc48);
  pstd::optional<pbrt::SquareMatrix<3>_>::operator=
            ((optional<pbrt::SquareMatrix<3>_> *)
             CONCAT17(in_stack_fffffffffffff8a7,
                      CONCAT16(in_stack_fffffffffffff8a6,
                               CONCAT24(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0))),
             (optional<pbrt::SquareMatrix<3>_> *)CONCAT44(in_stack_fffffffffffff89c,uVar14));
  pstd::optional<pbrt::SquareMatrix<3>_>::~optional((optional<pbrt::SquareMatrix<3>_> *)0x5ef319);
  uVar5 = pstd::optional<pbrt::SquareMatrix<3>_>::has_value
                    ((optional<pbrt::SquareMatrix<3>_> *)(local_3e8 + 1));
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff894,uVar13),(bool)uVar6);
  uVar6 = testing::AssertionResult::operator_cast_to_bool(local_570);
  if (!(bool)uVar6) {
    testing::Message::Message
              ((Message *)
               CONCAT17(uVar3,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffff8c4,
                                                      in_stack_fffffffffffff8c0))));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar2,in_stack_fffffffffffff908),&pAVar17->success_,
               in_stack_fffffffffffff8f8,(char *)CONCAT44(uVar16,in_stack_fffffffffffff8f0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               CONCAT17(uVar3,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffff8c4,
                                                      in_stack_fffffffffffff8c0))),type,
               (char *)CONCAT44(args_1,in_stack_fffffffffffff8b0),iVar15,
               (char *)CONCAT17(uVar5,CONCAT16(uVar6,CONCAT24(in_stack_fffffffffffff8a4,
                                                              in_stack_fffffffffffff8a0))));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff910,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff908));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff894,uVar13));
    std::__cxx11::string::~string(local_5a0);
    testing::Message::~Message((Message *)0x5ef463);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5ef4db);
  pstd::optional<pbrt::SquareMatrix<3>_>::~optional((optional<pbrt::SquareMatrix<3>_> *)0x5ef4e8);
  return;
}

Assistant:

TEST(SquareMatrix, Basics3) {
    SquareMatrix<3> m3;
    EXPECT_TRUE(m3.IsIdentity());

    EXPECT_EQ(m3, SquareMatrix<3>(1, 0, 0, 0, 1, 0, 0, 0, 1));
    EXPECT_NE(m3, SquareMatrix<3>(0, 1, 0, 0, 1, 0, 0, 0, 1));

    EXPECT_EQ(SquareMatrix<3>(2, 0, 0, 0, -1, 0, 0, 0, 3),
              SquareMatrix<3>::Diag(2, -1, 3));

    SquareMatrix<3> m(1, 2, 3, 4, 5, 6, 7, 8, 9);
    EXPECT_FALSE(m.IsIdentity());
    SquareMatrix<3> mt(1, 4, 7, 2, 5, 8, 3, 6, 9);
    EXPECT_EQ(Transpose(m), mt);

    pstd::array<Float, 3> v{1, -2, 4};
    pstd::array<Float, 3> vt = m * v;
    EXPECT_EQ(1 - 4 + 12, vt[0]);
    EXPECT_EQ(4 - 10 + 24, vt[1]);
    EXPECT_EQ(7 - 16 + 36, vt[2]);

    Vector3f v3(1, -2, 4);
    Vector3f v3t = m * v3;
    EXPECT_EQ(1 - 4 + 12, v3t[0]);
    EXPECT_EQ(4 - 10 + 24, v3t[1]);
    EXPECT_EQ(7 - 16 + 36, v3t[2]);

    pstd::optional<SquareMatrix<3>> inv = Inverse(m3);
    EXPECT_TRUE(inv.has_value());
    EXPECT_EQ(m3, *inv);

    SquareMatrix<3> ms(2, 0, 0, 0, 4, 0, 0, 0, -1);
    inv = Inverse(ms);
    EXPECT_TRUE(inv.has_value());
    EXPECT_EQ(SquareMatrix<3>(0.5, 0, 0, 0, .25, 0, 0, 0, -1), *inv);

    SquareMatrix<3> degen(0, 0, 2, 0, 0, 0, 1, 1, 1);
    inv = Inverse(degen);
    EXPECT_FALSE(inv.has_value());
}